

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.h
# Opt level: O3

void __thiscall gvr::Mesh::normalizeNormals(Mesh *this)

{
  float fVar1;
  float *pfVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  float fVar7;
  
  iVar3 = (this->super_PointCloud).n * 3;
  uVar4 = iVar3 - 3;
  if (-1 < (int)uVar4) {
    pfVar2 = this->normal;
    uVar6 = iVar3 - 1;
    lVar5 = (ulong)uVar4 + 3;
    do {
      fVar1 = pfVar2[lVar5 + -3];
      uVar4 = uVar6 - 1;
      fVar7 = SQRT(pfVar2[uVar6] * pfVar2[uVar6] + fVar1 * fVar1 + pfVar2[uVar4] * pfVar2[uVar4]);
      if (0.0 < fVar7) {
        pfVar2[lVar5 + -3] = fVar1 / fVar7;
        pfVar2[uVar4] = pfVar2[uVar4] / fVar7;
        pfVar2[uVar6] = pfVar2[uVar6] / fVar7;
      }
      uVar6 = uVar6 - 3;
      lVar5 = lVar5 + -3;
    } while (2 < lVar5);
  }
  return;
}

Assistant:

int getVertexCount() const { return n; }